

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlayout.cpp
# Opt level: O1

void QLayout::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QMargins *pQVar1;
  int *piVar2;
  int iVar3;
  QMargins QVar4;
  
  if (_c == WriteProperty) {
    piVar2 = (int *)*_a;
    if (_id == 2) {
      if (*(int *)(*(long *)(_o + 8) + 0x90) != *piVar2) {
        *(int *)(*(long *)(_o + 8) + 0x90) = *piVar2;
        (**(code **)(*(long *)_o + 0x70))(_o);
      }
    }
    else if (_id == 1) {
      setContentsMargins((QLayout *)_o,*piVar2,piVar2[1],piVar2[2],piVar2[3]);
    }
    else if (_id == 0) {
      (**(code **)(*(long *)_o + 0x68))(_o,*piVar2);
    }
  }
  else if (_c == ReadProperty) {
    pQVar1 = (QMargins *)*_a;
    if (_id == 2) {
      iVar3 = *(int *)(*(long *)(_o + 8) + 0x90);
    }
    else {
      if (_id == 1) {
        QVar4 = contentsMargins((QLayout *)_o);
        *pQVar1 = QVar4;
        goto LAB_002ec7fc;
      }
      if (_id != 0) goto LAB_002ec7fc;
      iVar3 = (**(code **)(*(long *)_o + 0x60))(_o);
    }
    (pQVar1->m_left).m_i = iVar3;
  }
LAB_002ec7fc:
  if (_id == 1 && _c == ResetProperty) {
    setContentsMargins((QLayout *)_o,-1,-1,-1,-1);
    return;
  }
  return;
}

Assistant:

void QLayout::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLayout *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->spacing(); break;
        case 1: *reinterpret_cast<QMargins*>(_v) = _t->contentsMargins(); break;
        case 2: *reinterpret_cast<SizeConstraint*>(_v) = _t->sizeConstraint(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSpacing(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setContentsMargins(*reinterpret_cast<QMargins*>(_v)); break;
        case 2: _t->setSizeConstraint(*reinterpret_cast<SizeConstraint*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 1: _t->unsetContentsMargins(); break;
        default: break;
        }
    }
}